

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall TestMaterial::RandomTestSupportFunctionAllObjects(TestMaterial *this)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  time_t tVar5;
  reference pvVar6;
  clock_t cVar7;
  S_Object *pSVar8;
  size_t sVar9;
  double dVar10;
  double dVar11;
  double local_f0;
  double local_e8;
  double local_e0;
  ulong local_d8;
  size_t i;
  long j_1;
  double local_c0;
  double local_b8;
  Vector3T<double,_false> local_b0;
  double local_98;
  double d;
  double c;
  double b;
  double a;
  long j;
  undefined1 local_68 [8];
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_> v
  ;
  clock_t end;
  clock_t begin;
  allocator<CD_Matrix::Vector3T<double,_false>_> local_29;
  undefined1 local_28 [8];
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  supportVector;
  TestMaterial *this_local;
  
  supportVector.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  poVar3 = std::operator<<((ostream *)&std::cout,"RandomTestSupportFunctionAllObjects");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar4 = sch::CD_Scene::size(&this->sObj);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::allocator(&local_29);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)local_28,sVar4 * 1000000,&local_29);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::~allocator(&local_29);
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::allocator
            ((allocator<CD_Matrix::Vector3T<double,_false>_> *)((long)&j + 7));
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)local_68,1000000,(allocator<CD_Matrix::Vector3T<double,_false>_> *)((long)&j + 7));
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::~allocator
            ((allocator<CD_Matrix::Vector3T<double,_false>_> *)((long)&j + 7));
  for (a = 0.0; (long)a < 1000000; a = (double)((long)a + 1)) {
    iVar2 = rand();
    b = (double)iVar2 / 2147483647.0;
    iVar2 = rand();
    c = (double)iVar2 / 2147483647.0;
    iVar2 = rand();
    d = (double)iVar2 / 2147483647.0;
    iVar2 = rand();
    local_98 = (double)iVar2 / 2147483647.0;
    dVar10 = log(b);
    dVar10 = sqrt(dVar10 * -2.0);
    local_b8 = cos(c * 6.283185307179586);
    local_b8 = dVar10 * local_b8;
    dVar10 = log(c);
    dVar10 = sqrt(dVar10 * -2.0);
    local_c0 = cos(b * 6.283185307179586);
    local_c0 = dVar10 * local_c0;
    dVar10 = log(d);
    dVar10 = sqrt(dVar10 * -2.0);
    dVar11 = cos(local_98 * 6.283185307179586);
    j_1 = (long)(dVar10 * dVar11);
    CD_Matrix::Vector3T<double,_false>::Vector3T(&local_b0,&local_b8,&local_c0,(double *)&j_1);
    pvVar6 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_68,(size_type)a);
    pvVar6->m_x = local_b0.m_x;
    pvVar6->m_y = local_b0.m_y;
    pvVar6->m_z = local_b0.m_z;
  }
  cVar7 = clock();
  for (i = 0; (long)i < 1000000; i = i + 1) {
    local_d8 = 0;
    while( true ) {
      uVar1 = local_d8;
      sVar4 = sch::CD_Scene::size(&this->sObj);
      if (sVar4 <= uVar1) break;
      pSVar8 = sch::CD_Scene::operator[](&this->sObj,local_d8);
      pvVar6 = std::
               vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
               ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                             *)local_68,i);
      (**(code **)(*(long *)pSVar8 + 0x20))(&local_f0,pSVar8,pvVar6);
      sVar4 = i;
      sVar9 = sch::CD_Scene::size(&this->sObj);
      pvVar6 = std::
               vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
               ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                             *)local_28,sVar4 * sVar9 + local_d8);
      pvVar6->m_x = local_f0;
      pvVar6->m_y = local_e8;
      pvVar6->m_z = local_e0;
      local_d8 = local_d8 + 1;
    }
  }
  v.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"  computation time: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(double)((long)v.
                                            super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     cVar7) / 1000000.0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  ~vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
           *)local_68);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  ~vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
           *)local_28);
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunctionAllObjects()
{
  std::cout << "RandomTestSupportFunctionAllObjects" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd * sObj.size());

  srand(static_cast<unsigned int>(time(NULL)));
  clock_t begin, end;

  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {
    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();
  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    for(size_t i=0; i<sObj.size(); i++)
      supportVector[j*sObj.size() + i] = sObj[i]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

#ifdef DO_TEST
# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupportall_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for(size_t i=0; i<supportVector.size(); ++i)
    outfile << supportVector[i] << std::endl;
  outfile.close();
# endif
#endif
}